

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assetsys.h
# Opt level: O2

assetsys_error_t assetsys_dismount(assetsys_t *sys,char *path,char *mounted_as)

{
  strpool_t *pool;
  assetsys_internal_mount_t *paVar1;
  mz_bool mVar2;
  int iVar3;
  size_t sVar4;
  unsigned_long_long handle;
  unsigned_long_long handle_00;
  long lVar5;
  assetsys_error_t aVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  unsigned_long_long handle_01;
  int j;
  int j_1;
  long lVar11;
  
  if (path == (char *)0x0) {
    return ASSETSYS_ERROR_INVALID_PARAMETER;
  }
  if (mounted_as != (char *)0x0) {
    pool = &sys->strpool;
    sVar4 = strlen(path);
    handle = strpool_inject(pool,path,(int)sVar4);
    sVar4 = strlen(mounted_as);
    handle_00 = strpool_inject(pool,mounted_as,(int)sVar4);
    uVar9 = 0;
    uVar8 = (ulong)(uint)sys->mounts_count;
    if (sys->mounts_count < 1) {
      uVar8 = uVar9;
    }
    lVar10 = 0x90;
    for (lVar5 = -0x18; uVar8 * 0x98 + lVar5 != -0x18; lVar5 = lVar5 + -0x98) {
      paVar1 = sys->mounts;
      if ((*(unsigned_long_long *)((long)paVar1 + lVar10 + -0x88) == handle_00) &&
         (*(unsigned_long_long *)((long)paVar1 + lVar10 + -0x90) == handle)) {
        aVar6 = ASSETSYS_SUCCESS;
        handle_01 = handle_00;
        if (*(int *)((long)paVar1 + lVar10 + -0x7c) == 1) {
          mVar2 = mz_zip_reader_end((mz_zip_archive *)((long)paVar1 - lVar5));
          aVar6 = (uint)(mVar2 != 0) * 4 + ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP;
          handle_01 = *(unsigned_long_long *)((long)paVar1 + lVar10 + -0x88);
        }
        strpool_decref(pool,handle_01);
        strpool_decref(pool,*(unsigned_long_long *)((long)paVar1 + lVar10 + -0x90));
        strpool_discard(pool,handle_00);
        strpool_discard(pool,handle);
        for (lVar5 = 0; lVar5 < *(int *)((long)&paVar1->path + lVar10); lVar5 = lVar5 + 1) {
          assetsys_internal_remove_collated
                    (sys,*(int *)(*(long *)((long)paVar1 + lVar10 + -8) + lVar5 * 4));
        }
        lVar5 = 8;
        for (lVar11 = 0; lVar11 < *(int *)((long)paVar1 + lVar10 + -0x10); lVar11 = lVar11 + 1) {
          assetsys_internal_remove_collated
                    (sys,*(int *)(*(long *)((long)paVar1 + lVar10 + -0x18) + lVar5));
          lVar5 = lVar5 + 0xc;
        }
        free(*(void **)((long)paVar1 + lVar10 + -8));
        free(*(void **)((long)paVar1 + lVar10 + -0x18));
        iVar3 = sys->mounts_count;
        uVar7 = iVar3 - (int)uVar9;
        if (0 < (int)uVar7) {
          memcpy((void *)((long)sys->mounts + lVar10 + -0x90),
                 (void *)((long)&sys->mounts->mounted_as + lVar10),(ulong)uVar7 * 0x98);
          iVar3 = sys->mounts_count;
        }
        sys->mounts_count = iVar3 + -1;
        return aVar6;
      }
      lVar10 = lVar10 + 0x98;
      uVar9 = (ulong)((int)uVar9 + 1);
    }
    strpool_discard(pool,handle_00);
    strpool_discard(pool,handle);
  }
  return ASSETSYS_ERROR_INVALID_MOUNT;
}

Assistant:

assetsys_error_t assetsys_dismount( assetsys_t* sys, char const* path, char const* mounted_as )
    {
    if( !path ) return ASSETSYS_ERROR_INVALID_PARAMETER;
    if( !mounted_as ) return ASSETSYS_ERROR_INVALID_MOUNT;

    ASSETSYS_U64 path_handle = strpool_inject( &sys->strpool, path, (int) strlen( path ) );
    ASSETSYS_U64 mount_handle = strpool_inject( &sys->strpool, mounted_as, (int) strlen( mounted_as ) );

    for( int i = 0; i < sys->mounts_count; ++i )
        {
        struct assetsys_internal_mount_t* mount = &sys->mounts[ i ];
        if( mount->mounted_as == mount_handle && mount->path == path_handle )
            {
            mz_bool result = 1;
            if( mount->type == ASSETSYS_INTERNAL_MOUNT_TYPE_ZIP ) result = mz_zip_reader_end( &mount->zip );

            strpool_decref( &sys->strpool, mount->mounted_as );
            strpool_decref( &sys->strpool, mount->path );
            strpool_discard( &sys->strpool, mount_handle );
            strpool_discard( &sys->strpool, path_handle );
            
            for( int j = 0; j < mount->dirs_count; ++j )
                assetsys_internal_remove_collated( sys, mount->dirs[ j ].collated_index );

            for( int j = 0; j < mount->files_count; ++j )
                assetsys_internal_remove_collated( sys, mount->files[ j ].collated_index );

            ASSETSYS_FREE( sys->memctx, mount->dirs );
            ASSETSYS_FREE( sys->memctx, mount->files );

            int count = sys->mounts_count - i;
            if( count > 0 ) memcpy( &sys->mounts[ i ], &sys->mounts[ i + 1 ], sizeof( *sys->mounts ) * count );
            --sys->mounts_count;

            return !result ? ASSETSYS_ERROR_FAILED_TO_CLOSE_ZIP : ASSETSYS_SUCCESS;
            }
        }

    strpool_discard( &sys->strpool, mount_handle );
    strpool_discard( &sys->strpool, path_handle );
    return ASSETSYS_ERROR_INVALID_MOUNT;
    }